

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O2

void duckdb_brotli::BrotliCreateZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
               Hasher *hasher,int *dist_cache,size_t *last_insert_len,Command *commands,
               size_t *num_commands,size_t *num_literals)

{
  ZopfliNode *array;
  size_t sVar1;
  
  sVar1 = num_bytes + 1;
  if (sVar1 == 0) {
    array = (ZopfliNode *)0x0;
  }
  else {
    array = (ZopfliNode *)BrotliAllocate(m,sVar1 * 0x10);
  }
  BrotliInitZopfliNodes(array,sVar1);
  sVar1 = BrotliZopfliComputeShortestPath
                    (m,num_bytes,position,ringbuffer,ringbuffer_mask,literal_context_lut,params,
                     dist_cache,hasher,array);
  *num_commands = *num_commands + sVar1;
  BrotliZopfliCreateCommands
            (num_bytes,position,array,dist_cache,last_insert_len,params,commands,num_literals);
  BrotliFree(m,array);
  return;
}

Assistant:

void duckdb_brotli::BrotliCreateZopfliBackwardReferences(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  ZopfliNode* nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(nodes)) return;
  BrotliInitZopfliNodes(nodes, num_bytes + 1);
  *num_commands += BrotliZopfliComputeShortestPath(m, num_bytes,
      position, ringbuffer, ringbuffer_mask, literal_context_lut, params,
      dist_cache, hasher, nodes);
  if (BROTLI_IS_OOM(m)) return;
  BrotliZopfliCreateCommands(num_bytes, position, nodes, dist_cache,
      last_insert_len, params, commands, num_literals);
  BROTLI_FREE(m, nodes);
}